

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QUrl __thiscall QCborValue::toUrl(QCborValue *this,QUrl *defaultValue)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  ByteData *pBVar4;
  long in_RSI;
  QUrlPrivate *in_RDI;
  long in_FS_OFFSET;
  ByteData *byteData;
  QUrl *in_stack_ffffffffffffff78;
  QUrl *in_stack_ffffffffffffff80;
  QUrlPrivate *this_00;
  ParsingMode in_stack_ffffffffffffffa4;
  QByteArrayView in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (((*(long *)(in_RSI + 8) == 0) || (bVar2 = isUrl((QCborValue *)0x470693), !bVar2)) ||
     (qVar3 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(*(long *)(in_RSI + 8) + 0x28))
     , qVar3 != 2)) {
    QUrl::QUrl(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    pBVar4 = QCborContainerPrivate::byteData
                       ((QCborContainerPrivate *)in_RDI,(qsizetype)in_stack_ffffffffffffff80);
    if (pBVar4 == (ByteData *)0x0) {
      QUrl::QUrl((QUrl *)in_RDI);
    }
    else {
      QtCbor::ByteData::asByteArrayView((ByteData *)in_RDI);
      QByteArrayView::QByteArrayView<QByteArray,_true>
                ((QByteArrayView *)this_00,(QByteArray *)in_RDI);
      QUrl::fromEncoded(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffa4);
      QByteArray::~QByteArray((QByteArray *)0x470736);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QUrl)this_00;
}

Assistant:

QUrl QCborValue::toUrl(const QUrl &defaultValue) const
{
    if (!container || !isUrl() || container->elements.size() != 2)
        return defaultValue;

    Q_ASSERT(n == -1);
    const ByteData *byteData = container->byteData(1);
    if (!byteData)
        return QUrl();  // valid, empty URL

    return QUrl::fromEncoded(byteData->asByteArrayView());
}